

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

uint __thiscall lzham::symbol_codec::decode_peek_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  
  if (num_bits == 0) {
    return 0;
  }
  if (this->m_bit_count < (int)num_bits) {
    do {
      pbVar4 = this->m_pDecode_buf_next;
      if (pbVar4 == this->m_pDecode_buf_end) {
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar4 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar4 = this->m_pDecode_buf;
          this->m_pDecode_buf_end = pbVar4 + this->m_decode_buf_size;
          this->m_pDecode_buf_next = pbVar4;
          if (0 < (long)this->m_decode_buf_size) goto LAB_00115d2d;
        }
        uVar3 = 0;
      }
      else {
LAB_00115d2d:
        this->m_pDecode_buf_next = pbVar4 + 1;
        uVar3 = (ulong)*pbVar4;
      }
      iVar2 = this->m_bit_count;
      iVar1 = iVar2 + 8;
      this->m_bit_count = iVar1;
      this->m_bit_buf = this->m_bit_buf | uVar3 << (0x38U - (char)iVar2 & 0x3f);
    } while (iVar1 < (int)num_bits);
  }
  return (uint)(this->m_bit_buf >> (-(char)num_bits & 0x3fU));
}

Assistant:

uint symbol_codec::decode_peek_bits(uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cDecoding);
      LZHAM_ASSERT(num_bits <= 25);

      if (!num_bits)
         return 0;

      while (m_bit_count < (int)num_bits)
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         LZHAM_ASSERT(m_bit_count <= cBitBufSize);

         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      return static_cast<uint>(m_bit_buf >> (cBitBufSize - num_bits));
   }